

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,mz_uint flags)

{
  ulong uVar1;
  ushort uVar2;
  ushort uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  mz_bool mVar7;
  uint uVar8;
  size_t sVar9;
  size_t sVar10;
  mz_zip_internal_state *pmVar11;
  short *__ptr;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  int *piVar19;
  mz_zip_archive *pZip_00;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  ulong min_new_capacity;
  mz_zip_internal_state *pmVar23;
  mz_zip_archive *pmVar24;
  mz_uint64 mVar25;
  short *psVar26;
  long lVar27;
  bool bVar28;
  mz_uint32 zip64_end_of_central_dir_header_u32 [14];
  mz_uint32 zip64_end_of_central_dir_locator_u32 [5];
  mz_uint32 buf_u32 [1024];
  int local_1098;
  ulong local_1094;
  uint local_1088;
  uint local_1084;
  uint local_1080;
  int local_107c;
  uint local_1078;
  int local_1074;
  uint local_1070;
  int local_106c;
  mz_uint64 local_1068;
  ulong local_1060;
  int local_1058 [2];
  ulong local_1050;
  int local_1048;
  int local_1038;
  ushort local_1034;
  ushort local_1032;
  ushort local_1030;
  ushort local_102e;
  uint local_102c;
  uint local_1028;
  
  uVar16 = pZip->m_archive_size;
  if (uVar16 < 0x16) {
LAB_00107890:
    pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
  }
  else {
    mVar25 = 0;
    if (0x1000 < (long)uVar16) {
      mVar25 = uVar16 - 0x1000;
    }
    uVar22 = 0x1000;
    if (0x1000 < (long)uVar16) {
      uVar22 = uVar16;
    }
    lVar27 = 0x1000 - uVar22;
    lVar18 = -uVar22;
    do {
      uVar22 = uVar16 - mVar25;
      sVar10 = 0x1000;
      if (uVar22 < 0x1000) {
        sVar10 = uVar22;
      }
      sVar9 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar25,&local_1038,sVar10);
      if (sVar9 != sVar10) break;
      if (3 < uVar22) {
        uVar16 = uVar16 + lVar27;
        uVar22 = 0x1000;
        if (uVar16 < 0x1000) {
          uVar22 = uVar16;
        }
        uVar13 = (ulong)((int)uVar22 - 4);
        piVar19 = &local_1038;
        lVar21 = lVar18;
        iVar5 = (int)uVar22 + -3;
        do {
          if ((*(int *)((long)piVar19 + uVar13) == 0x6054b50) &&
             (0x15 < (0x1000 - uVar13) + lVar21 + pZip->m_archive_size)) {
            uVar22 = 0x1000;
            if (uVar16 < 0x1000) {
              uVar22 = uVar16;
            }
            uVar22 = ((ulong)((int)uVar22 - 4) - lVar21) - 0x1000;
            sVar10 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar22,&local_1038,0x16);
            if (sVar10 != 0x16) {
              pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
              return 0;
            }
            if (local_1038 != 0x6054b50) {
              pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
              return 0;
            }
            if (0x4b < (long)uVar22) {
              uVar13 = 0x1000;
              if (uVar16 < 0x1000) {
                uVar13 = uVar16;
              }
              sVar10 = (*pZip->m_pRead)(pZip->m_pIO_opaque,
                                        ((ulong)((int)uVar13 - 4) - lVar21) - 0x1014,local_1058,0x14
                                       );
              if ((sVar10 == 0x14) && (local_1058[0] == 0x7064b50)) {
                pZip->m_pState->m_zip64 = 1;
              }
            }
            if (pZip->m_pState->m_zip64 != 0) {
              if ((long)uVar22 < 0x4c) goto LAB_00107890;
              uVar13 = 0x1000;
              if (uVar16 < 0x1000) {
                uVar13 = uVar16;
              }
              sVar10 = (*pZip->m_pRead)(pZip->m_pIO_opaque,
                                        ((ulong)((int)uVar13 - 4) - lVar21) - 0x104c,&local_1098,
                                        0x38);
              if (((sVar10 != 0x38) || (local_1098 != 0x6064b50)) &&
                 ((pZip->m_archive_size - 0x38 < local_1050 ||
                  ((sVar10 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_1050,&local_1098,0x38),
                   sVar10 != 0x38 || (local_1098 != 0x6064b50)))))) goto LAB_00107890;
            }
            pZip->m_total_files = (uint)local_102e;
            pmVar23 = pZip->m_pState;
            iVar5 = pmVar23->m_zip64;
            if (iVar5 == 0) {
              local_1080 = (uint)local_1030;
              local_1084 = (uint)local_1032;
              uVar13 = (ulong)local_1028;
              uVar15 = local_102c;
              local_1078 = (uint)local_102e;
              uVar20 = (uint)local_1034;
            }
            else {
              if (local_1094 < 0x2c) goto LAB_00107aba;
              if (local_1048 != 1) goto LAB_00107f1b;
              if ((local_1074 != 0) || (pZip->m_total_files = local_1078, local_107c != 0)) {
                pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
                return 0;
              }
              uVar13 = local_1068;
              uVar15 = local_1070;
              uVar20 = local_1088;
              if (local_106c != 0) {
                pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
                return 0;
              }
            }
            if ((local_1078 != local_1080) ||
               ((uVar20 != 0 || local_1084 != 0 && (local_1084 != 1 || uVar20 != 1))))
            goto LAB_00107f1b;
            uVar14 = (ulong)uVar15;
            min_new_capacity = (ulong)local_1078;
            if (uVar14 <= min_new_capacity * 0x2e && min_new_capacity * 0x2e - uVar14 != 0)
            goto LAB_00107aba;
            uVar1 = uVar13 + uVar14;
            uVar4 = pZip->m_archive_size;
            if ((uVar4 < uVar1) || (uVar22 < uVar1)) goto LAB_00107aba;
            uVar22 = 0x1000;
            if (uVar16 < 0x1000) {
              uVar22 = uVar16;
            }
            uVar22 = ((((int)uVar22 - 4) - uVar1) - lVar21) - 0x1000;
            if (iVar5 != 0) {
              if (uVar22 < 0x4c) goto LAB_00107aba;
              uVar22 = 0x1000;
              if (uVar16 < 0x1000) {
                uVar22 = uVar16;
              }
              uVar22 = ((((int)uVar22 - 4) - uVar1) - lVar21) - 0x104c;
            }
            if (((pZip->m_zip_type & ~MZ_ZIP_TYPE_USER) == MZ_ZIP_TYPE_FILE) &&
               (pmVar23->m_file_archive_start_ofs == 0)) {
              pmVar23->m_file_archive_start_ofs = uVar22;
              pZip->m_archive_size = uVar4 - uVar22;
            }
            pZip->m_central_directory_file_ofs = uVar13;
            pZip_00 = (mz_zip_archive *)0x0;
            if (local_1078 == 0) goto LAB_00107f9b;
            pmVar11 = pmVar23;
            if ((pmVar23->m_central_dir).m_capacity < uVar14) {
              mVar7 = mz_zip_array_ensure_capacity(pZip,&pmVar23->m_central_dir,uVar14,0);
              if (mVar7 == 0) goto LAB_00107fb9;
              pmVar11 = pZip->m_pState;
              min_new_capacity = (ulong)pZip->m_total_files;
            }
            (pmVar23->m_central_dir).m_size = uVar14;
            pmVar23 = pmVar11;
            if ((pmVar11->m_central_dir_offsets).m_capacity < min_new_capacity) {
              mVar7 = mz_zip_array_ensure_capacity
                                (pZip,&pmVar11->m_central_dir_offsets,min_new_capacity,0);
              if (mVar7 == 0) {
LAB_00107fb9:
                pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
                return 0;
              }
              pmVar23 = pZip->m_pState;
            }
            (pmVar11->m_central_dir_offsets).m_size = min_new_capacity;
            pmVar11 = pmVar23;
            if ((flags >> 0xb & 1) == 0) {
              uVar16 = (ulong)pZip->m_total_files;
              if ((pmVar23->m_sorted_central_dir_offsets).m_capacity < uVar16) {
                mVar7 = mz_zip_array_ensure_capacity
                                  (pZip,&pmVar23->m_sorted_central_dir_offsets,uVar16,0);
                if (mVar7 == 0) {
                  pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
                  return 0;
                }
                pmVar11 = pZip->m_pState;
              }
              (pmVar23->m_sorted_central_dir_offsets).m_size = uVar16;
            }
            sVar10 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar13,(pmVar11->m_central_dir).m_p,uVar14)
            ;
            if (sVar10 != uVar14) {
              pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
              return 0;
            }
            pZip_00 = (mz_zip_archive *)0x0;
            if (pZip->m_total_files == 0) goto LAB_00107f9b;
            piVar19 = (int *)(pZip->m_pState->m_central_dir).m_p;
            pmVar24 = (mz_zip_archive *)0x0;
            goto LAB_00107cef;
          }
          lVar21 = lVar21 + 1;
          piVar19 = (int *)((long)piVar19 + -1);
          iVar6 = iVar5 + -1;
          bVar28 = 0 < iVar5;
          iVar5 = iVar6;
        } while (iVar6 != 0 && bVar28);
      }
      if (mVar25 == 0) {
        if (pZip == (mz_zip_archive *)0x0) {
          return 0;
        }
        break;
      }
      uVar16 = pZip->m_archive_size;
      uVar22 = uVar16 - mVar25;
      mVar25 = mVar25 - 0xffd;
      lVar27 = lVar27 + 0xffd;
      lVar18 = lVar18 + 0xffd;
    } while (uVar22 < 0x10015);
    pZip->m_last_error = MZ_ZIP_FAILED_FINDING_CENTRAL_DIR;
  }
  return 0;
LAB_00107cef:
  if ((uVar15 < 0x2e) || (*piVar19 != 0x2014b50)) {
LAB_00107aba:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  pmVar23 = pZip->m_pState;
  *(int *)((long)(pmVar23->m_central_dir_offsets).m_p + (long)pmVar24 * 4) =
       (int)piVar19 - *(int *)&(pmVar23->m_central_dir).m_p;
  if ((flags >> 0xb & 1) == 0) {
    *(int *)((long)(pmVar23->m_sorted_central_dir_offsets).m_p + (long)pmVar24 * 4) = (int)pmVar24;
  }
  uVar8 = piVar19[5];
  uVar22 = (ulong)uVar8;
  uVar16 = (ulong)(uint)piVar19[6];
  if (pmVar23->m_zip64_has_extended_info_fields == 0) {
    uVar2 = *(ushort *)((long)piVar19 + 0x1e);
    uVar17 = (uint)uVar2;
    if (uVar2 != 0) {
      uVar14 = uVar16;
      if (uVar16 < uVar22) {
        uVar14 = uVar22;
      }
      uVar12 = (uint)uVar14;
      if (uVar14 <= *(uint *)((long)piVar19 + 0x2a)) {
        uVar12 = *(uint *)((long)piVar19 + 0x2a);
      }
      if (uVar12 == 0xffffffff) {
        uVar3 = *(ushort *)(piVar19 + 7);
        local_1060 = uVar16;
        if (uVar15 < (uint)uVar3 + (uint)uVar2 + 0x2e) {
          uVar16 = (ulong)(uint)uVar2;
          __ptr = (short *)malloc(uVar16);
          if (__ptr == (short *)0x0) {
            pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
            return 0;
          }
          sVar10 = (*pZip->m_pRead)(pZip->m_pIO_opaque,(ulong)uVar3 + uVar13 + 0x2e,__ptr,uVar16);
          psVar26 = __ptr;
          if (sVar10 != uVar16) {
            free(__ptr);
            pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
            return 0;
          }
        }
        else {
          __ptr = (short *)0x0;
          psVar26 = (short *)((long)piVar19 + (ulong)uVar3 + 0x2e);
        }
        do {
          if (uVar17 < 4) {
LAB_00107fd1:
            free(__ptr);
            pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
            return 0;
          }
          uVar16 = (ulong)(ushort)psVar26[1] + 4;
          if (uVar17 < uVar16) goto LAB_00107fd1;
          if (*psVar26 == 1) {
            pmVar23 = pZip->m_pState;
            pmVar23->m_zip64 = 1;
            pmVar23->m_zip64_has_extended_info_fields = 1;
            break;
          }
          uVar17 = (uVar17 - (ushort)psVar26[1]) - 4;
          psVar26 = (short *)((long)psVar26 + uVar16);
        } while (uVar17 != 0);
        free(__ptr);
        uVar16 = local_1060;
      }
    }
  }
  if (((uVar8 != 0xffffffff) && ((uint)uVar16 != 0xffffffff)) &&
     (((*(int *)((long)piVar19 + 10) == 0 && ((uint)uVar16 != uVar8)) ||
      ((uVar16 != 0 && (uVar22 == 0)))))) goto LAB_00107aba;
  uVar2 = *(ushort *)((long)piVar19 + 0x22);
  if ((uVar2 == 0xffff) || (uVar2 != 1 && uVar2 != uVar20)) {
LAB_00107f1b:
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
    return 0;
  }
  if ((uVar8 != 0xffffffff) &&
     (pZip->m_archive_size < *(uint *)((long)piVar19 + 0x2a) + uVar22 + 0x1e)) goto LAB_00107aba;
  if ((*(byte *)((long)piVar19 + 9) & 0x20) != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    return 0;
  }
  uVar8 = (uint)*(ushort *)(piVar19 + 8) +
          (uint)*(ushort *)((long)piVar19 + 0x1e) + (uint)*(ushort *)(piVar19 + 7) + 0x2e;
  bVar28 = uVar15 < uVar8;
  uVar15 = uVar15 - uVar8;
  if (bVar28) goto LAB_00107aba;
  piVar19 = (int *)((long)piVar19 + (ulong)uVar8);
  pmVar24 = (mz_zip_archive *)((long)&pmVar24->m_archive_size + 1);
  pZip_00 = (mz_zip_archive *)(ulong)pZip->m_total_files;
  if (pZip_00 <= pmVar24) {
LAB_00107f9b:
    if ((flags >> 0xb & 1) == 0) {
      mz_zip_reader_sort_central_dir_offsets_by_filename(pZip_00);
      return 1;
    }
    return 1;
  }
  goto LAB_00107cef;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,
                                              mz_uint flags) {
  mz_uint cdir_size = 0, cdir_entries_on_this_disk = 0, num_this_disk = 0,
          cdir_disk_index = 0;
  mz_uint64 cdir_ofs = 0, eocd_ofs = 0, archive_ofs = 0;
  mz_int64 cur_file_ofs = 0;
  const mz_uint8 *p;

  mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
  mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
  mz_bool sort_central_dir =
      ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
  mz_uint32 zip64_end_of_central_dir_locator_u32
      [(MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + sizeof(mz_uint32) - 1) /
       sizeof(mz_uint32)];
  mz_uint8 *pZip64_locator = (mz_uint8 *)zip64_end_of_central_dir_locator_u32;

  mz_uint32 zip64_end_of_central_dir_header_u32
      [(MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
       sizeof(mz_uint32)];
  mz_uint8 *pZip64_end_of_central_dir =
      (mz_uint8 *)zip64_end_of_central_dir_header_u32;

  mz_uint64 zip64_end_of_central_dir_ofs = 0;

  /* Basic sanity checks - reject files which are too small, and check the first
   * 4 bytes of the file to make sure a local header is there. */
  if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

  if (!mz_zip_reader_locate_header_sig(
          pZip, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG,
          MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE, &cur_file_ofs))
    return mz_zip_set_error(pZip, MZ_ZIP_FAILED_FINDING_CENTRAL_DIR);

  eocd_ofs = cur_file_ofs;
  /* Read and verify the end of central directory record. */
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf,
                    MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

  if (MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) !=
      MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG)
    return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

  if (cur_file_ofs >= (MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE +
                       MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)) {
    if (pZip->m_pRead(pZip->m_pIO_opaque,
                      cur_file_ofs - MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE,
                      pZip64_locator,
                      MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) ==
        MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) {
      if (MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_SIG_OFS) ==
          MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIG) {
        pZip->m_pState->m_zip64 = MZ_TRUE;
      }
    }
  }

  if (pZip->m_pState->m_zip64) {
    /* Try locating the EOCD64 right before the EOCD64 locator. This works even
     * when the effective start of the zip header is not yet known. */
    if (cur_file_ofs < MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE +
                           MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)
      return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    zip64_end_of_central_dir_ofs = cur_file_ofs -
                                   MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE -
                                   MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE;

    if (!mz_zip_reader_eocd64_valid(pZip, zip64_end_of_central_dir_ofs,
                                    pZip64_end_of_central_dir)) {
      /* That failed, try reading where the locator tells us to. */
      zip64_end_of_central_dir_ofs = MZ_READ_LE64(
          pZip64_locator + MZ_ZIP64_ECDL_REL_OFS_TO_ZIP64_ECDR_OFS);

      if (zip64_end_of_central_dir_ofs >
          (pZip->m_archive_size - MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

      if (!mz_zip_reader_eocd64_valid(pZip, zip64_end_of_central_dir_ofs,
                                      pZip64_end_of_central_dir))
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);
    }
  }

  pZip->m_total_files = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS);
  cdir_entries_on_this_disk =
      MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
  num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
  cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
  cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS);
  cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);

  if (pZip->m_pState->m_zip64) {
    mz_uint32 zip64_total_num_of_disks =
        MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_TOTAL_NUMBER_OF_DISKS_OFS);
    mz_uint64 zip64_cdir_total_entries = MZ_READ_LE64(
        pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_TOTAL_ENTRIES_OFS);
    mz_uint64 zip64_cdir_total_entries_on_this_disk = MZ_READ_LE64(
        pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
    mz_uint64 zip64_size_of_end_of_central_dir_record = MZ_READ_LE64(
        pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIZE_OF_RECORD_OFS);
    mz_uint64 zip64_size_of_central_directory =
        MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_SIZE_OFS);

    if (zip64_size_of_end_of_central_dir_record <
        (MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE - 12))
      return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if (zip64_total_num_of_disks != 1U)
      return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    /* Check for miniz's practical limits */
    if (zip64_cdir_total_entries > MZ_UINT32_MAX)
      return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

    pZip->m_total_files = (mz_uint32)zip64_cdir_total_entries;

    if (zip64_cdir_total_entries_on_this_disk > MZ_UINT32_MAX)
      return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

    cdir_entries_on_this_disk =
        (mz_uint32)zip64_cdir_total_entries_on_this_disk;

    /* Check for miniz's current practical limits (sorry, this should be enough
     * for millions of files) */
    if (zip64_size_of_central_directory > MZ_UINT32_MAX)
      return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    cdir_size = (mz_uint32)zip64_size_of_central_directory;

    num_this_disk = MZ_READ_LE32(pZip64_end_of_central_dir +
                                 MZ_ZIP64_ECDH_NUM_THIS_DISK_OFS);

    cdir_disk_index = MZ_READ_LE32(pZip64_end_of_central_dir +
                                   MZ_ZIP64_ECDH_NUM_DISK_CDIR_OFS);

    cdir_ofs =
        MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_OFS_OFS);
  }

  if (pZip->m_total_files != cdir_entries_on_this_disk)
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

  if (((num_this_disk | cdir_disk_index) != 0) &&
      ((num_this_disk != 1) || (cdir_disk_index != 1)))
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

  if (cdir_size <
      (mz_uint64)pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  if (eocd_ofs < cdir_ofs + cdir_size)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  /* The end of central dir follows the central dir, unless the zip file has
   * some trailing data (e.g. it is appended to an executable file). */
  archive_ofs = eocd_ofs - (cdir_ofs + cdir_size);
  if (pZip->m_pState->m_zip64) {
    if (archive_ofs < MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE +
                          MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE)
      return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    archive_ofs -= MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE +
                   MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE;
  }

  /* Update the archive start position, but only if not specified. */
  if ((pZip->m_zip_type == MZ_ZIP_TYPE_FILE ||
       pZip->m_zip_type == MZ_ZIP_TYPE_CFILE) &&
      pZip->m_pState->m_file_archive_start_ofs == 0) {
    pZip->m_pState->m_file_archive_start_ofs = archive_ofs;
    pZip->m_archive_size -= archive_ofs;
  }

  pZip->m_central_directory_file_ofs = cdir_ofs;

  if (pZip->m_total_files) {
    mz_uint i, n;
    /* Read the entire central directory into a heap block, and allocate another
     * heap block to hold the unsorted central dir file record offsets, and
     * possibly another to hold the sorted indices. */
    if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size,
                              MZ_FALSE)) ||
        (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets,
                              pZip->m_total_files, MZ_FALSE)))
      return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    if (sort_central_dir) {
      if (!mz_zip_array_resize(pZip,
                               &pZip->m_pState->m_sorted_central_dir_offsets,
                               pZip->m_total_files, MZ_FALSE))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs,
                      pZip->m_pState->m_central_dir.m_p,
                      cdir_size) != cdir_size)
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    /* Now create an index into the central directory file records, do some
     * basic sanity checking on each record */
    p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
    for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i) {
      mz_uint total_header_size, disk_index, bit_flags, filename_size,
          ext_data_size;
      mz_uint64 comp_size, decomp_size, local_header_ofs;

      if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) ||
          (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

      MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32,
                           i) =
          (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);

      if (sort_central_dir)
        MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets,
                             mz_uint32, i) = i;

      comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
      decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
      local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
      filename_size = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
      ext_data_size = MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS);

      if ((!pZip->m_pState->m_zip64_has_extended_info_fields) &&
          (ext_data_size) &&
          (MZ_MAX(MZ_MAX(comp_size, decomp_size), local_header_ofs) ==
           MZ_UINT32_MAX)) {
        /* Attempt to find zip64 extended information field in the entry's extra
         * data */
        mz_uint32 extra_size_remaining = ext_data_size;

        if (extra_size_remaining) {
          const mz_uint8 *pExtra_data;
          void *buf = NULL;

          if (MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size + ext_data_size >
              n) {
            buf = MZ_MALLOC(ext_data_size);
            if (buf == NULL)
              return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

            if (pZip->m_pRead(pZip->m_pIO_opaque,
                              cdir_ofs + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                                  filename_size,
                              buf, ext_data_size) != ext_data_size) {
              MZ_FREE(buf);
              return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            pExtra_data = (mz_uint8 *)buf;
          } else {
            pExtra_data = p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size;
          }

          do {
            mz_uint32 field_id;
            mz_uint32 field_data_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2)) {
              MZ_FREE(buf);
              return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));

            if ((field_data_size + sizeof(mz_uint16) * 2) >
                extra_size_remaining) {
              MZ_FREE(buf);
              return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID) {
              /* Ok, the archive didn't have any zip64 headers but it uses a
               * zip64 extended information field so mark it as zip64 anyway
               * (this can occur with infozip's zip util when it reads
               * compresses files from stdin). */
              pZip->m_pState->m_zip64 = MZ_TRUE;
              pZip->m_pState->m_zip64_has_extended_info_fields = MZ_TRUE;
              break;
            }

            pExtra_data += sizeof(mz_uint16) * 2 + field_data_size;
            extra_size_remaining =
                extra_size_remaining - sizeof(mz_uint16) * 2 - field_data_size;
          } while (extra_size_remaining);

          MZ_FREE(buf);
        }
      }

      /* I've seen archives that aren't marked as zip64 that uses zip64 ext
       * data, argh */
      if ((comp_size != MZ_UINT32_MAX) && (decomp_size != MZ_UINT32_MAX)) {
        if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) &&
             (decomp_size != comp_size)) ||
            (decomp_size && !comp_size))
          return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
      }

      disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
      if ((disk_index == MZ_UINT16_MAX) ||
          ((disk_index != num_this_disk) && (disk_index != 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

      if (comp_size != MZ_UINT32_MAX) {
        if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) +
             MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
          return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
      }

      bit_flags = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
      if (bit_flags & MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_LOCAL_DIR_IS_MASKED)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

      if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) >
          n)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

      n -= total_header_size;
      p += total_header_size;
    }
  }

  if (sort_central_dir)
    mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

  return MZ_TRUE;
}